

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O3

void __thiscall asl::WebSocketServer::serve(WebSocketServer *this,Socket *client)

{
  char b;
  int iVar1;
  int iVar2;
  String *pSVar3;
  undefined8 uVar4;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  long lVar6;
  bool bVar7;
  String name;
  Dic<asl::String> headers;
  String value;
  String cname;
  String line;
  String head;
  String res;
  String method;
  String local_f0;
  Array<asl::Map<asl::String,_asl::String>::KeyVal> local_d8;
  String local_d0;
  String local_b8;
  Socket *local_a0;
  String local_98;
  String local_80;
  WebSocketServer *local_68;
  String local_60;
  String local_48;
  
  local_a0 = client;
  local_68 = this;
  Socket_::readLine(&local_80,(Socket_ *)(client->super_SmartObject)._p);
  iVar1 = String::indexOf(&local_80,' ',0);
  if (iVar1 != -1) {
    iVar2 = String::indexOf(&local_80,' ',iVar1 + 1);
    if (iVar2 != -1) {
      String::substring(&local_48,&local_80,0,iVar1);
      String::substring(&local_60,&local_80,iVar1 + 1,iVar2);
      local_98.field_2._space[0] = '\0';
      local_98._size = 0;
      local_98._len = 0;
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::alloc(&local_d8,0);
      while( true ) {
        Socket_::readLine(&local_f0,(Socket_ *)(local_a0->super_SmartObject)._p);
        uVar4 = &local_f0.field_2;
        if (local_f0._size != 0) {
          uVar4 = local_f0.field_2._str;
        }
        String::assign(&local_98,(char *)uVar4,local_f0._len);
        paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_98.field_2._1_7_,local_98.field_2._space[0]);
        if (local_98._size == 0) {
          paVar5 = &local_98.field_2;
        }
        if (paVar5->_space[0] == '\r') {
          paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)
                   CONCAT71(local_98.field_2._1_7_,local_98.field_2._space[0]);
          if (local_98._size == 0) {
            paVar5 = &local_98.field_2;
          }
          bVar7 = paVar5->_space[1] == '\0';
        }
        else {
          bVar7 = false;
        }
        if (local_f0._size != 0) {
          free(local_f0.field_2._str);
        }
        if (bVar7) {
          String::String(&local_b8,"\n");
          String::String(&local_d0,": ");
          Map<asl::String,_asl::String>::join
                    (&local_f0,(Map<asl::String,_asl::String> *)&local_d8,&local_b8,&local_d0);
          if (local_f0._size != 0) {
            free(local_f0.field_2._str);
          }
          if (local_d0._size != 0) {
            free((void *)CONCAT71(local_d0.field_2._1_7_,local_d0.field_2._space[0]));
          }
          if (local_b8._size != 0) {
            free((void *)CONCAT71(local_b8.field_2._1_7_,local_b8.field_2._space[0]));
          }
          process(local_68,local_a0,(Dic<asl::String> *)&local_d8);
          goto LAB_001280d2;
        }
        pSVar3 = String::trim(&local_98);
        if (pSVar3->_size == 0) {
          paVar5 = &pSVar3->field_2;
        }
        else {
          paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar3->field_2)._str;
        }
        String::assign(&local_98,paVar5->_space,pSVar3->_len);
        iVar1 = String::indexOf(&local_98,':',0);
        if (iVar1 < 0) break;
        String::substring(&local_f0,&local_98,0,iVar1);
        local_b8.field_2._space[0] = '\0';
        local_b8._size = 0;
        local_b8._len = 0;
        if (0 < local_f0._len) {
          bVar7 = true;
          lVar6 = 0;
          do {
            uVar4 = &local_f0.field_2;
            if (local_f0._size != 0) {
              uVar4 = local_f0.field_2._str;
            }
            if (bVar7) {
              iVar2 = toupper((int)*(char *)(uVar4 + lVar6));
              b = (char)iVar2;
            }
            else {
              iVar2 = tolower((int)*(char *)(uVar4 + lVar6));
              b = (char)iVar2;
            }
            String::operator+=(&local_b8,b);
            uVar4 = &local_f0.field_2;
            if (local_f0._size != 0) {
              uVar4 = local_f0.field_2._str;
            }
            iVar2 = isalnum((int)*(char *)(uVar4 + lVar6));
            bVar7 = iVar2 == 0;
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_f0._len);
        }
        if (iVar1 < local_98._len + -1) {
          String::substring(&local_d0,&local_98,iVar1 + 2,local_98._len);
        }
        else {
          local_d0.field_2._space[0] = '\0';
          local_d0._size = 0;
          local_d0._len = 0;
        }
        pSVar3 = Map<asl::String,_asl::String>::operator[]
                           ((Map<asl::String,_asl::String> *)&local_d8,&local_b8);
        paVar5 = &local_d0.field_2;
        if (local_d0._size != 0) {
          paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)
                   CONCAT71(local_d0.field_2._1_7_,local_d0.field_2._space[0]);
        }
        String::assign(pSVar3,paVar5->_space,local_d0._len);
        if (local_d0._size != 0) {
          free((void *)CONCAT71(local_d0.field_2._1_7_,local_d0.field_2._space[0]));
        }
        if (local_b8._size != 0) {
          free((void *)CONCAT71(local_b8.field_2._1_7_,local_b8.field_2._space[0]));
        }
        if (local_f0._size != 0) {
          free(local_f0.field_2._str);
        }
      }
      (*((local_a0->super_SmartObject)._p)->_vptr_SmartObject_[0xb])();
LAB_001280d2:
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array(&local_d8);
      if (local_98._size != 0) {
        free((void *)CONCAT71(local_98.field_2._1_7_,local_98.field_2._space[0]));
      }
      if (local_60._size != 0) {
        free(local_60.field_2._str);
      }
      if (local_48._size != 0) {
        free(local_48.field_2._str);
      }
    }
  }
  if (local_80._size != 0) {
    free(local_80.field_2._str);
  }
  return;
}

Assistant:

void WebSocketServer::serve(Socket client)
{
	String head = client.readLine();
	int i = head.indexOf(' ');
	if (i == -1)
		return;
	int j = head.indexOf(' ', i + 1);
	if (j == -1)
		return;
	String method = head.substring(0, i);
	String res = head.substring(i + 1, j);

	String line;
	Dic<String> headers;
	while (line = client.readLine(), line != "\r")
	{
		line = line.trim();
		int c = line.indexOf(':');
		if (c < 0) {
			client.close();
			return;
		}
		String name = line.substring(0, c);
		String cname;
		bool capitalize = true;
		for (int k = 0; k < name.length(); k++)
		{
			cname << char(capitalize ? toupper(name[k]) : tolower(name[k]));
			capitalize = !isalnum(name[k]);
		}

		String value = (c < line.length() - 1) ? line.substring(c + 2) : String();
		headers[cname] = value;
	}

	DEBUG_LOG("%s\n\n\n", *headers.join("\n", ": "));

	process(client, headers);
}